

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O1

ON_Locale *
ON_Locale::FromSubtags
          (ON_Locale *__return_storage_ptr__,char *language_code,char *script,
          char *region_identifier)

{
  char *locale_name;
  char Script [6];
  ON_String language_name;
  ON_String local_30;
  ON_String local_28;
  
  if ((language_code == (char *)0x0) || (*language_code == '\0')) {
    memcpy(__return_storage_ptr__,&InvariantCulture,0xa0);
  }
  else {
    ON_String::ON_String(&local_28,language_code);
    ON_String::MakeLowerOrdinal(&local_28);
    if ((script != (char *)0x0) &&
       ((*script != '\0' ||
        ((((script[1] != '\0' && (script[2] != '\0')) && (script[3] != '\0')) && (script[4] == '\0')
         ))))) {
      local_30.m_s._0_1_ = 0x2d;
      local_30.m_s._1_1_ = ON_String::MapCharacterOrdinal(UpperOrdinal,*script);
      local_30.m_s._2_1_ = ON_String::MapCharacterOrdinal(LowerOrdinal,*script);
      local_30.m_s._3_1_ = ON_String::MapCharacterOrdinal(LowerOrdinal,*script);
      local_30.m_s._4_1_ = ON_String::MapCharacterOrdinal(LowerOrdinal,*script);
      local_30.m_s._5_1_ = 0;
      ON_String::operator+=(&local_28,(char *)&local_30);
    }
    if ((region_identifier != (char *)0x0) && (*region_identifier != '\0')) {
      ON_String::ON_String(&local_30,'-',1);
      ON_String::operator+=(&local_30,region_identifier);
      ON_String::MakeUpperOrdinal(&local_30);
      ON_String::operator+=(&local_28,&local_30);
      ON_String::~ON_String(&local_30);
    }
    locale_name = ON_String::operator_cast_to_char_(&local_28);
    FromWindowsName(__return_storage_ptr__,locale_name);
    ON_String::~ON_String(&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_Locale ON_Locale::FromSubtags(
  const char* language_code,
  const char* script,
  const char* region_identifier
  )
{
  if (nullptr == language_code || 0 == language_code[0])
    return ON_Locale::InvariantCulture;

  ON_String language_name(language_code);
  language_name.MakeLowerOrdinal();

  if ( nullptr != script && (0 != script[0] || (0 != script[1] && 0 != script[2] && 0 != script[3] && 0 == script[4])) )
  {
    char Script[6];
    Script[0] = '-';
    Script[1] = ON_String::MapCharacterOrdinal(ON_StringMapOrdinalType::UpperOrdinal,script[0]);
    Script[2] = ON_String::MapCharacterOrdinal(ON_StringMapOrdinalType::LowerOrdinal,script[0]);
    Script[3] = ON_String::MapCharacterOrdinal(ON_StringMapOrdinalType::LowerOrdinal,script[0]);
    Script[4] = ON_String::MapCharacterOrdinal(ON_StringMapOrdinalType::LowerOrdinal,script[0]);
    Script[5] = 0;
    language_name += Script;
  }

  if (nullptr != region_identifier && 0 != region_identifier[0])
  {
    ON_String REGION = '-';
    REGION += region_identifier;
    REGION.MakeUpperOrdinal();
    language_name += REGION;
  }

  return ON_Locale::FromBCP47LanguageName(language_name);
}